

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * declaration_list(dmr_C *C,token *token,symbol_list **list)

{
  ctype *pcVar1;
  ulong uVar2;
  ident *ident;
  symbol *psVar3;
  ulong uVar4;
  undefined1 auVar5 [8];
  unsigned_long uVar6;
  unsigned_long uVar7;
  context_list *pcVar8;
  undefined8 uVar9;
  token *ptVar10;
  symbol *ptr;
  char *pcVar11;
  symbol *psVar12;
  char *fmt;
  position pos;
  symbol *psVar13;
  char cVar14;
  bool bVar15;
  bool bVar16;
  ctype saved;
  undefined1 auStack_a8 [8];
  decl_state ctx;
  expression *local_38;
  
  ctx.ident = (ident **)0x0;
  ctx.mode = (symbol_op *)0x0;
  ctx.ctype.as = 0;
  ctx.ctype._28_4_ = 0;
  ctx.ctype.base_type = (symbol *)0x0;
  ctx.ctype.alignment = 0;
  ctx.ctype.contexts = (context_list *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  ctx.ctype.modifiers = 0;
  ptVar10 = declaration_specifiers(C,token,(decl_state *)auStack_a8);
  uVar9 = ctx.ctype._24_8_;
  pcVar8 = ctx.ctype.contexts;
  uVar7 = ctx.ctype.alignment;
  uVar6 = ctx.ctype.modifiers;
  auVar5 = auStack_a8;
  bVar15 = ctx.mode._1_1_ != '\0';
  uVar2 = *(ulong *)(storage_modifiers_mod + ((ulong)ctx.mode >> 0x10 & 0xff) * 8);
  bVar16 = ctx.mode._3_1_ != '\0';
  do {
    auStack_a8 = auVar5;
    ctx.ctype.modifiers = uVar6;
    ctx.ctype.alignment = uVar7;
    ctx.ctype.contexts = pcVar8;
    ctx.ctype._24_8_ = uVar9;
    ptr = dmrC_alloc_symbol(C->S,ptVar10->pos,3);
    ctx.ctype.base_type = (symbol *)&ptr->ident;
    ptVar10 = declarator(C,ptVar10,(decl_state *)auStack_a8);
    if (((SUB84(ptVar10->pos,0) & 0x3f) == 0x11) && ((ptVar10->field_2).special == 0x3a)) {
      psVar12 = &C->S->int_type;
      if ((symbol *)ctx.ctype._24_8_ != psVar12) {
        cVar14 = *(char *)ctx.ctype._24_8_;
        pcVar11 = (char *)ctx.ctype._24_8_;
        if (cVar14 == '\x03') {
          pcVar11 = *(char **)(ctx.ctype._24_8_ + 0x80);
          cVar14 = *pcVar11;
        }
        if (cVar14 == '\t') {
          pcVar11 = *(char **)(pcVar11 + 0x80);
          cVar14 = *pcVar11;
        }
        if ((cVar14 != '\r') && ((symbol *)*(undefined1 **)(pcVar11 + 0x80) != psVar12)) {
          pcVar11 = dmrC_show_typename(C,(symbol *)ctx.ctype._24_8_);
          dmrC_sparse_error(C,ptVar10->pos,"invalid bitfield specifier for type %s.",pcVar11);
          ptVar10 = dmrC_conditional_expression(C,ptVar10->next,&local_38);
          goto LAB_0011a79a;
        }
      }
      psVar12 = dmrC_alloc_symbol(C->S,ptVar10->pos,0xd);
      (psVar12->field_14).field_2.ctype.base_type = (symbol *)ctx.ctype._24_8_;
      (psVar12->field_14).field_2.ctype.modifiers = (unsigned_long)auStack_a8;
      auStack_a8 = (undefined1  [8])0x0;
      ctx.ctype._24_8_ = psVar12;
      ptVar10 = dmrC_conditional_expression(C,ptVar10->next,&local_38);
      pcVar11 = (char *)dmrC_const_expression_value(C,local_38);
      (psVar12->field_14).field_1.normal = (int)pcVar11;
      if (((ulong)pcVar11 & 0xffffffff80000000) == 0) {
        ident = *(ident **)ctx.ctype.base_type;
        if (pcVar11 == (char *)0x0 && ident != (ident *)0x0) {
          pcVar11 = dmrC_show_ident(C,ident);
          pos = ptVar10->pos;
          fmt = "invalid named zero-width bitfield `%s\'";
          goto LAB_0011a774;
        }
        if (ident != (ident *)0x0) {
          psVar3 = (psVar12->field_14).field_2.ctype.base_type;
          psVar13 = psVar12;
          if (psVar3 != &C->S->int_type) {
            psVar13 = psVar3;
          }
          uVar4 = (psVar13->field_14).field_2.ctype.modifiers;
          if (((pcVar11 == (char *)0x1) && (C->Wone_bit_signed_bitfield != 0)) &&
             ((uVar4 & 0x80) == 0)) {
            dmrC_sparse_error(C,ptVar10->pos,"dubious one-bit signed bitfield");
          }
          if (((C->Wdefault_bitfield_sign != 0) && (*(char *)psVar13 != '\t')) &&
             (((psVar13->field_14).field_2.ctype.modifiers & 0x40000000) == 0 && (uVar4 & 0x80) == 0
             )) {
            dmrC_warning(C,ptVar10->pos,"dubious bitfield without explicit `signed\' or `unsigned\'"
                        );
          }
        }
      }
      else {
        pos = ptVar10->pos;
        fmt = "invalid bitfield width, %lld.";
LAB_0011a774:
        dmrC_sparse_error(C,pos,fmt,pcVar11);
        pcVar11 = (char *)0xffffffffffffffff;
      }
      (psVar12->field_14).field_1.normal = (int)pcVar11;
      psVar12->endpos = ptVar10->pos;
    }
LAB_0011a79a:
    ptVar10 = handle_attributes(C,ptVar10,(decl_state *)auStack_a8,8);
    apply_modifiers(C,ptVar10->pos,(decl_state *)auStack_a8);
    (ptr->field_14).field_2.ctype.modifiers = (unsigned_long)auStack_a8;
    (ptr->field_14).field_2.ctype.alignment = ctx.ctype.modifiers;
    pcVar1 = &(ptr->field_14).field_2.ctype;
    pcVar1->modifiers = pcVar1->modifiers | (ulong)bVar16 << 0x11 | (ulong)bVar15 << 0x12 | uVar2;
    (ptr->field_14).field_2.ctype.base_type = (symbol *)ctx.ctype._24_8_;
    (ptr->field_14).field_2.ctype.contexts = (context_list *)ctx.ctype.alignment;
    *(context_list **)&(ptr->field_14).field_2.ctype.as = ctx.ctype.contexts;
    ptr->endpos = ptVar10->pos;
    ptrlist_add((ptr_list **)list,ptr,&C->ptrlist_allocator);
    if ((((ulong)ptVar10->pos & 0x3f) != 0x11) || ((ptVar10->field_2).special != 0x2c)) {
      return ptVar10;
    }
    ptVar10 = ptVar10->next;
  } while( true );
}

Assistant:

static struct token *declaration_list(struct dmr_C *C, struct token *token, struct symbol_list **list)
{
	struct decl_state ctx = {.prefer_abstract = 0};
	struct ctype saved;
	unsigned long mod;

	token = declaration_specifiers(C, token, &ctx);
	mod = storage_modifiers(C, &ctx);
	saved = ctx.ctype;
	for (;;) {
		struct symbol *decl = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		ctx.ident = &decl->ident;

		token = declarator(C, token, &ctx);
		if (dmrC_match_op(token, ':'))
			token = handle_bitfield(C, token, &ctx);

		token = handle_attributes(C, token, &ctx, KW_ATTRIBUTE);
		apply_modifiers(C, token->pos, &ctx);

		decl->ctype = ctx.ctype;
		decl->ctype.modifiers |= mod;
		decl->endpos = token->pos;
		dmrC_add_symbol(C, list, decl);
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
		ctx.ctype = saved;
	}
	return token;
}